

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::clara::TextFlow::Spacer::Spacer(Spacer *this,size_t spaceWidth)

{
  allocator<char> local_39;
  string local_38;
  
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  Column::Column(&this->super_Column,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  Column::width(&this->super_Column,spaceWidth);
  return;
}

Assistant:

explicit Spacer(size_t spaceWidth) : Column("") {
		width(spaceWidth);
	}